

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglprogrambinarycache.cpp
# Opt level: O2

void __thiscall
QOpenGLProgramBinaryCache::QOpenGLProgramBinaryCache(QOpenGLProgramBinaryCache *this)

{
  QString *this_00;
  qsizetype qVar1;
  Data *pDVar2;
  bool bVar3;
  char16_t *pcVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<char16_t> local_d8;
  QStringBuilder<QLatin1String,_QString> local_b8;
  QArrayDataPointer<char16_t> local_88;
  QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_currentCacheDir;
  *(undefined8 *)((long)&(this->m_currentCacheDir).d.ptr + 1) = 0;
  *(undefined8 *)((long)&(this->m_currentCacheDir).d.size + 1) = 0;
  (this->m_currentCacheDir).d.d = (Data *)0x0;
  (this->m_currentCacheDir).d.ptr = (char16_t *)0x0;
  (this->m_localCacheDir).d.ptr = (char16_t *)0x0;
  (this->m_localCacheDir).d.size = 0;
  (this->m_globalCacheDir).d.size = 0;
  (this->m_localCacheDir).d.d = (Data *)0x0;
  (this->m_globalCacheDir).d.d = (Data *)0x0;
  (this->m_globalCacheDir).d.ptr = (char16_t *)0x0;
  QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry>::QCache(&this->m_memCache,100);
  (this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QSysInfo::buildAbi();
  local_b8.b.d.size = local_d8.size;
  local_b8.b.d.ptr = local_d8.ptr;
  local_b8.b.d.d = local_d8.d;
  local_b8.a.m_size = 0xf;
  local_b8.a.m_data = "/qtshadercache-";
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (char16_t *)0x0;
  local_d8.size = 0;
  QStringBuilder<QLatin1String,_QString>::QStringBuilder(&local_68.a,&local_b8);
  local_68.b = L'/';
  QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t>::convertTo<QString>
            ((QString *)&local_88,&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68.a.b.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8.b.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  local_b8.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.a.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.a.m_data = &DAT_aaaaaaaaaaaaaaaa;
  QStandardPaths::writableLocation((StandardLocation)&local_b8);
  local_d8.d = (Data *)&local_b8;
  local_d8.ptr = (char16_t *)&local_88;
  QStringBuilder<const_QString_&,_const_QString_&>::convertTo<QString>
            ((QString *)&local_68,(QStringBuilder<const_QString_&,_const_QString_&> *)&local_d8);
  pDVar2 = (this->m_globalCacheDir).d.d;
  pcVar4 = (this->m_globalCacheDir).d.ptr;
  (this->m_globalCacheDir).d.d =
       (Data *)CONCAT44(local_68.a.a.m_size._4_4_,(undefined4)local_68.a.a.m_size);
  (this->m_globalCacheDir).d.ptr =
       (char16_t *)CONCAT44(local_68.a.a.m_data._4_4_,local_68.a.a.m_data._0_4_);
  local_68.a.a.m_size._0_4_ = SUB84(pDVar2,0);
  local_68.a.a.m_size._4_4_ = (undefined4)((ulong)pDVar2 >> 0x20);
  local_68.a.a.m_data._0_4_ = SUB84(pcVar4,0);
  local_68.a.a.m_data._4_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
  qVar1 = (this->m_globalCacheDir).d.size;
  (this->m_globalCacheDir).d.size = CONCAT44(local_68.a.b.d.d._4_4_,local_68.a.b.d.d._0_4_);
  local_68.a.b.d.d._0_4_ = (undefined4)qVar1;
  local_68.a.b.d.d._4_4_ = (undefined4)((ulong)qVar1 >> 0x20);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  QStandardPaths::writableLocation((StandardLocation)&local_f8);
  qVar1 = local_f8.size;
  pcVar4 = local_f8.ptr;
  pDVar2 = local_f8.d;
  local_f8.d = (Data *)0x0;
  local_f8.ptr = (char16_t *)0x0;
  local_f8.size = 0;
  local_68.a.a.m_size._0_4_ = SUB84(pDVar2,0);
  local_68.a.a.m_size._4_4_ = (undefined4)((ulong)pDVar2 >> 0x20);
  local_68.a.a.m_data._0_4_ = SUB84(pcVar4,0);
  local_68.a.a.m_data._4_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
  local_68.a.b.d.d._0_4_ = (undefined4)qVar1;
  local_68.a.b.d.d._4_4_ = (undefined4)((ulong)qVar1 >> 0x20);
  local_68.a.b.d.ptr = (char16_t *)&local_88;
  QStringBuilder<QString,_const_QString_&>::convertTo<QString>
            ((QString *)&local_d8,(QStringBuilder<QString,_const_QString_&> *)&local_68);
  pDVar2 = (this->m_localCacheDir).d.d;
  pcVar4 = (this->m_localCacheDir).d.ptr;
  (this->m_localCacheDir).d.d = local_d8.d;
  (this->m_localCacheDir).d.ptr = local_d8.ptr;
  qVar1 = (this->m_localCacheDir).d.size;
  (this->m_localCacheDir).d.size = local_d8.size;
  local_d8.d = pDVar2;
  local_d8.ptr = pcVar4;
  local_d8.size = qVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  if (local_b8.b.d.d == (Data *)0x0) {
    if ((this->m_cacheWritable & 1U) != 0) goto LAB_004d904a;
  }
  else {
    QString::operator=(this_00,(QString *)this);
    bVar3 = qt_ensureWritableDir(this_00);
    this->m_cacheWritable = bVar3;
    if (bVar3) goto LAB_004d904a;
  }
  QString::operator=(this_00,(QString *)&this->m_localCacheDir);
  bVar3 = qt_ensureWritableDir(this_00);
  this->m_cacheWritable = bVar3;
LAB_004d904a:
  QtPrivateLogging::lcOpenGLProgramDiskCache();
  if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
             _q_value._M_base._M_i & 1) != 0) {
    local_68.a.a.m_size._0_4_ = 2;
    local_68.a.a.m_size._4_4_ = 0;
    local_68.a.a.m_data._0_4_ = 0;
    local_68.a.a.m_data._4_4_ = 0;
    local_68.a.b.d.d._0_4_ = 0;
    local_68.a.b.d.d._4_4_ = 0;
    local_68.a.b.d.ptr = (char16_t *)QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
    QString::toLocal8Bit((QByteArray *)&local_d8,this_00);
    pcVar4 = local_d8.ptr;
    if (local_d8.ptr == (char16_t *)0x0) {
      pcVar4 = (char16_t *)&QByteArray::_empty;
    }
    QMessageLogger::debug
              ((char *)&local_68,"Cache location \'%s\' writable = %d",pcVar4,
               (ulong)this->m_cacheWritable);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_d8);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QOpenGLProgramBinaryCache::QOpenGLProgramBinaryCache()
    : m_cacheWritable(false)
{
    const QString subPath = "/qtshadercache-"_L1 + QSysInfo::buildAbi() + u'/';
    const QString sharedCachePath = QStandardPaths::writableLocation(QStandardPaths::GenericCacheLocation);
    m_globalCacheDir = sharedCachePath + subPath;
    m_localCacheDir = QStandardPaths::writableLocation(QStandardPaths::CacheLocation) + subPath;

    if (!sharedCachePath.isEmpty()) {
        m_currentCacheDir = m_globalCacheDir;
        m_cacheWritable = qt_ensureWritableDir(m_currentCacheDir);
    }
    if (!m_cacheWritable) {
        m_currentCacheDir = m_localCacheDir;
        m_cacheWritable = qt_ensureWritableDir(m_currentCacheDir);
    }

    qCDebug(lcOpenGLProgramDiskCache, "Cache location '%s' writable = %d", qPrintable(m_currentCacheDir), m_cacheWritable);
}